

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O3

void __thiscall Liby::TimerQueue::insert(TimerQueue *this,shared_ptr<Liby::Timer> *timer)

{
  _Atomic_word *p_Var1;
  BasicHandler *pBVar2;
  int iVar3;
  WeakTimerHolder weakTimerHolder;
  WeakTimerHolder WStack_58;
  
  WeakTimerHolder::WeakTimerHolder(&WStack_58,timer);
  if ((this->queue_).size_ == 0) {
    updateTimerfd(this,&((timer->super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                        )->timeout_);
  }
  BinaryHeap<Liby::WeakTimerHolder>::insert(&this->queue_,&WStack_58);
  if (WStack_58.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(WStack_58.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = (WStack_58.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_weak_count;
      (WStack_58.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*(WStack_58.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  if (WStack_58.timer_.handler_.super__Function_base._M_manager != (_Manager_type)0x0) {
    pBVar2 = &WStack_58.timer_.handler_;
    (*WStack_58.timer_.handler_.super__Function_base._M_manager)
              ((_Any_data *)pBVar2,(_Any_data *)pBVar2,__destroy_functor);
  }
  return;
}

Assistant:

void TimerQueue::insert(const std::shared_ptr<Timer> &timer) {
    WeakTimerHolder weakTimerHolder(timer);
    if (queue_.empty()) {
        updateTimerfd(timer->timeout());
    }
    queue_.insert(weakTimerHolder);
}